

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O3

ostream * __thiscall tcu::Format::Hex<8UL>::toStream(Hex<8UL> *this,ostream *stream)

{
  ostream *poVar1;
  string local_30;
  
  Hex<8ul>::toString_abi_cxx11_(&local_30,this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return poVar1;
}

Assistant:

std::ostream& toStream (std::ostream& stream) const
	{
		return stream << this->toString();
	}